

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *
vkt::BindingModel::anon_unknown_1::allocateAndBindObjectMemory
          (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *__return_storage_ptr__,
          DeviceInterface *vki,VkDevice device,Allocator *allocator,VkBuffer buffer,
          MemoryRequirement requirement)

{
  VkResult result;
  Allocation *pAVar1;
  VkDeviceMemory VVar2;
  VkDeviceSize VVar3;
  undefined1 local_50 [8];
  VkMemoryRequirements requirements;
  Allocator *allocator_local;
  VkDevice device_local;
  DeviceInterface *vki_local;
  MemoryRequirement requirement_local;
  VkBuffer buffer_local;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *allocation;
  
  requirements._16_8_ = allocator;
  ::vk::getBufferMemoryRequirements((VkMemoryRequirements *)local_50,vki,device,buffer);
  (**(code **)(*(long *)requirements._16_8_ + 0x18))
            (__return_storage_ptr__,requirements._16_8_,(VkMemoryRequirements *)local_50,
             requirement.m_flags);
  pAVar1 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&__return_storage_ptr__->
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar2 = ::vk::Allocation::getMemory(pAVar1);
  pAVar1 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&__return_storage_ptr__->
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar3 = ::vk::Allocation::getOffset(pAVar1);
  result = (*vki->_vptr_DeviceInterface[0xc])(vki,device,buffer.m_internal,VVar2.m_internal,VVar3);
  ::vk::checkResult(result,
                    "vki.bindBufferMemory(device, buffer, allocation->getMemory(), allocation->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0x16b);
  return __return_storage_ptr__;
}

Assistant:

de::MovePtr<vk::Allocation> allocateAndBindObjectMemory (const vk::DeviceInterface& vki, vk::VkDevice device, vk::Allocator& allocator, vk::VkBuffer buffer, vk::MemoryRequirement requirement)
{
	const vk::VkMemoryRequirements	requirements	= vk::getBufferMemoryRequirements(vki, device, buffer);
	de::MovePtr<vk::Allocation>		allocation		= allocator.allocate(requirements, requirement);

	VK_CHECK(vki.bindBufferMemory(device, buffer, allocation->getMemory(), allocation->getOffset()));
	return allocation;
}